

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFI.h
# Opt level: O0

void __thiscall
dg::pta::PointerAnalysisFI::PointerAnalysisFI
          (PointerAnalysisFI *this,PointerGraph *ps,PointerAnalysisOptions *opts)

{
  size_t sVar1;
  PointerAnalysisOptions *in_RSI;
  PointerGraph *in_RDI;
  PointerGraph *in_stack_ffffffffffffff88;
  PointerAnalysis *in_stack_ffffffffffffff90;
  ulong local_68 [2];
  size_type in_stack_ffffffffffffffa8;
  vector<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
  *in_stack_ffffffffffffffb0;
  
  PointerAnalysisOptions::PointerAnalysisOptions((PointerAnalysisOptions *)in_RDI,in_RSI);
  PointerAnalysis::PointerAnalysis
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(PointerAnalysisOptions *)in_RDI);
  PointerAnalysisOptions::~PointerAnalysisOptions((PointerAnalysisOptions *)0x17bfcb);
  *(undefined ***)in_RDI = &PTR__PointerAnalysisFI_001a2ab8;
  std::
  vector<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
  ::vector((vector<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
            *)0x17bfea);
  sVar1 = PointerGraph::size(in_RDI);
  local_68[0] = sVar1 / 100;
  std::max<unsigned_long>(local_68,(unsigned_long *)&stack0xffffffffffffff90);
  std::
  vector<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>,_std::allocator<std::unique_ptr<dg::pta::MemoryObject,_std::default_delete<dg::pta::MemoryObject>_>_>_>
  ::reserve(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

PointerAnalysisFI(PointerGraph *ps, const PointerAnalysisOptions &opts)
            : PointerAnalysis(ps, opts) {
        memory_objects.reserve(
                std::max(ps->size() / 100, static_cast<size_t>(8)));
    }